

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

commonNaNT * float64ToCommonNaN(commonNaNT *__return_storage_ptr__,float64 a,float_status *status)

{
  int iVar1;
  float_status *status_local;
  float64 a_local;
  
  iVar1 = float64_is_signaling_nan_tricore(a,status);
  if (iVar1 != 0) {
    float_raise_tricore('\x01',status);
  }
  __return_storage_ptr__->sign = (byte)(a >> 0x3f);
  __return_storage_ptr__->low = 0;
  __return_storage_ptr__->high = a << 0xc;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT float64ToCommonNaN(float64 a, float_status *status)
{
    commonNaNT z;

    if (float64_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    z.sign = float64_val(a) >> 63;
    z.low = 0;
    z.high = float64_val(a) << 12;
    return z;
}